

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O1

int OPENSSL_timegm(tm *tm,time_t *out)

{
  int iVar1;
  int64_t posix_time;
  time_t local_10;
  
  iVar1 = OPENSSL_tm_to_posix(tm,&local_10);
  if (iVar1 != 0) {
    *out = local_10;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int OPENSSL_timegm(const struct tm *tm, time_t *out) {
  static_assert(
      sizeof(time_t) == sizeof(int32_t) || sizeof(time_t) == sizeof(int64_t),
      "time_t is broken");
  int64_t posix_time;
  if (!OPENSSL_tm_to_posix(tm, &posix_time)) {
    return 0;
  }
  if (sizeof(time_t) == sizeof(int32_t) &&
      (posix_time > INT32_MAX || posix_time < INT32_MIN)) {
    return 0;
  }
  *out = (time_t)posix_time;
  return 1;
}